

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_motion::save(xr_motion *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_motion *this_local;
  
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::w_s32(w,this->m_frame_start);
  xr_writer::w_s32(w,this->m_frame_end);
  xr_writer::w_float(w,this->m_fps);
  return;
}

Assistant:

void xr_motion::save(xr_writer& w) const
{
	w.w_sz(m_name);
	w.w_s32(m_frame_start);
	w.w_s32(m_frame_end);
	w.w_float(m_fps);
}